

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

uint lodepng_encode_memory
               (uchar **out,size_t *outsize,uchar *image,uint w,uint h,LodePNGColorType colortype,
               uint bitdepth)

{
  uint uVar1;
  undefined1 auStack_218 [12];
  undefined1 local_20c [20];
  undefined1 auStack_1f8 [12];
  undefined8 local_1ec;
  undefined8 uStack_1e4;
  undefined8 uStack_1dc;
  undefined8 uStack_1d4;
  uint local_1cc;
  _func_uint_uchar_ptr_ptr_size_t_ptr_uchar_ptr_size_t_LodePNGCompressSettings_ptr *local_1c8;
  _func_uint_uchar_ptr_ptr_size_t_ptr_uchar_ptr_size_t_LodePNGCompressSettings_ptr *p_Stack_1c0;
  void *local_1b8;
  undefined8 local_1b0;
  LodePNGFilterStrategy local_1a8;
  uchar *local_1a0;
  undefined8 uStack_198;
  uint local_190;
  LodePNGColorType local_188;
  uint local_184;
  undefined1 local_180 [32];
  undefined1 local_160 [56];
  undefined1 local_128 [32];
  undefined1 auStack_108 [20];
  undefined1 local_f4 [12];
  undefined1 auStack_e8 [20];
  uint local_bc;
  uint local_ac;
  uint local_a4;
  uint local_80;
  uint local_78;
  char *local_70;
  uchar *puStack_68;
  undefined1 auStack_58 [16];
  undefined1 local_48 [16];
  undefined1 auStack_38 [16];
  uint local_28;
  
  auStack_58 = ZEXT816(0) << 0x40;
  auStack_1f8 = (undefined1  [12])0x0;
  auStack_218 = auStack_58._0_12_;
  local_20c = ZEXT420(0);
  local_1ec._0_4_ = 1;
  local_1ec._4_4_ = 1;
  uStack_1e4._0_4_ = 0;
  uStack_1e4._4_4_ = 2;
  uStack_1dc._0_4_ = 1;
  uStack_1dc._4_4_ = 0x800;
  uStack_1d4._0_4_ = 3;
  uStack_1d4._4_4_ = 0x80;
  local_1cc = 1;
  local_1c8 = (_func_uint_uchar_ptr_ptr_size_t_ptr_uchar_ptr_size_t_LodePNGCompressSettings_ptr *)
              0x0;
  p_Stack_1c0 = (_func_uint_uchar_ptr_ptr_size_t_ptr_uchar_ptr_size_t_LodePNGCompressSettings_ptr *)
                0x0;
  local_1b8 = (void *)0x0;
  local_1a8 = LFS_MINSUM;
  local_1b0._0_4_ = 1;
  local_1b0._4_4_ = 1;
  local_1a0 = (uchar *)0x0;
  uStack_198._0_4_ = 0;
  uStack_198._4_4_ = 0;
  local_190 = 1;
  local_180 = ZEXT1632(auStack_58);
  local_160._8_4_ = 0;
  local_160._0_4_ = 0;
  local_160._4_4_ = 0;
  local_bc = 0;
  local_ac = 0;
  local_a4 = 0;
  local_80 = 0;
  local_78 = 0;
  auStack_38 = (undefined1  [16])0x0;
  local_48 = (undefined1  [16])0x0;
  local_128 = ZEXT1632(auStack_58);
  auStack_e8 = ZEXT420(0);
  auStack_108._16_4_ = 0;
  auStack_108._0_16_ = auStack_58;
  local_f4 = (undefined1  [12])0x0;
  local_70 = (char *)0x0;
  puStack_68 = (uchar *)0x0;
  local_28 = 1;
  local_184 = bitdepth;
  local_160._20_4_ = bitdepth;
  local_188 = colortype;
  local_160._16_4_ = colortype;
  local_160._24_32_ = local_180;
  lodepng_encode(out,outsize,image,w,h,(LodePNGState *)auStack_218);
  uVar1 = local_28;
  lodepng_state_cleanup((LodePNGState *)auStack_218);
  return uVar1;
}

Assistant:

unsigned lodepng_encode_memory(unsigned char** out, size_t* outsize, const unsigned char* image,
  unsigned w, unsigned h, LodePNGColorType colortype, unsigned bitdepth) {
  unsigned error;
  LodePNGState state;
  lodepng_state_init(&state);
  state.info_raw.colortype = colortype;
  state.info_raw.bitdepth = bitdepth;
  state.info_png.color.colortype = colortype;
  state.info_png.color.bitdepth = bitdepth;
  lodepng_encode(out, outsize, image, w, h, &state);
  error = state.error;
  lodepng_state_cleanup(&state);
  return error;
}